

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
AddProperty<Js::PropertyRecord_const*>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true> *this,
          DynamicObject *instance,PropertyRecord *propertyKey,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  Type *pTVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  Var pvVar4;
  bool bVar5;
  ushort uVar6;
  PropertyIndex PVar7;
  int iVar8;
  BOOL BVar9;
  undefined4 *puVar10;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this_00;
  SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *this_01;
  BigSimpleDictionaryTypeHandler *this_02;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar11;
  JavascriptString **ppJVar12;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 in_register_00000081;
  uint uVar13;
  JavascriptString *local_70;
  JavascriptString *deletedPropertyKey;
  Var local_60;
  PropertyValueInfo *local_58;
  ScriptContext *local_50;
  PropertyRecord *local_48;
  PropertyRecord *propertyKey_local;
  uint local_38;
  ushort local_32 [4];
  unsigned_short index;
  
  propertyKey_local._4_4_ = (uint)CONCAT71(in_register_00000081,attributes);
  local_50 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  local_48 = propertyKey;
  if ((propertyKey->isSymbol == false) &&
     (iVar8 = JsUtil::
              BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
              ::FindEntryWithKey<Js::PropertyRecord_const*>
                        (*(BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                           **)(this + 0x18),&local_48), -1 < iVar8)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xa6e,"(!propertyMap->TryGetReference(propertyKey, &descriptor))",
                                "!propertyMap->TryGetReference(propertyKey, &descriptor)");
    if (!bVar5) goto LAB_00e0dfd2;
    *puVar10 = 0;
  }
  if (local_48->isNumeric == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xa70,"(!TPropertyKey_IsNumeric(propertyKey))",
                                "!TPropertyKey_IsNumeric(propertyKey)");
    if (!bVar5) goto LAB_00e0dfd2;
    *puVar10 = 0;
  }
  local_58 = info;
  if (((flags & PropertyOperation_Force) == PropertyOperation_None) &&
     (bVar5 = DynamicTypeHandler::VerifyIsExtensible
                        ((DynamicTypeHandler *)this,local_50,
                         (flags & (PropertyOperation_ThrowIfNotExtensible|
                                  PropertyOperation_StrictMode)) != PropertyOperation_None), !bVar5)
     ) {
    return 0;
  }
  if (((byte)this[9] & 4) == 0) {
    pTVar1 = (instance->super_RecyclableObject).type.ptr;
    this_00 = (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *)this;
    if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
      if ((((byte)this[9] & 0x10) != 0) ||
         (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01')) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xa93,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar5) goto LAB_00e0dfd2;
        *puVar10 = 0;
      }
      DynamicObject::ChangeType(instance);
    }
  }
  else {
    this_00 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::
              ConvertToNonSharedSimpleDictionaryType
                        ((SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>
                          *)this,instance);
  }
  if (((uint)local_48->pid < 0x10) || (local_48->isSymbol == true)) {
    bVar5 = Phases::IsEnabled((Phases *)&DAT_015bc490,TypeHandlerTransitionPhase);
    if (bVar5) {
      Output::Print(
                   L"Transitioning from string keyed to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"
                   );
      Output::Flush();
    }
    this_01 = (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *)
              ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::PropertyRecord_const*,true>
                        (this,instance);
    BVar9 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
            AddProperty<Js::PropertyRecord_const*>
                      (this_01,instance,local_48,value,propertyKey_local._4_1_,local_58,flags,
                       possibleSideEffects);
    return BVar9;
  }
  if (*(int *)(this + 0xc) <= (int)(uint)*(ushort *)(this + 0x2a)) {
    if (0xfffd < *(int *)(this + 0xc)) {
      this_02 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::
                ConvertToBigSimpleDictionaryTypeHandler
                          ((SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>
                            *)this,instance);
      BVar9 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
              AddProperty<Js::PropertyRecord_const*>
                        ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this_02
                         ,instance,local_48,value,propertyKey_local._4_1_,local_58,flags,
                         possibleSideEffects);
      return BVar9;
    }
    SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::
    EnsureSlotCapacity(this_00,instance);
  }
  local_60 = value;
  if (value == (Var)0x0 && (char)((flags & PropertyOperation_SpecialValue) >> 4) == '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xaaf,
                                "((flags & PropertyOperation_SpecialValue) != 0 || value != nullptr)"
                                ,"(flags & PropertyOperation_SpecialValue) != 0 || value != nullptr"
                               );
    if (!bVar5) goto LAB_00e0dfd2;
    *puVar10 = 0;
  }
  if (((this_00->super_DynamicTypeHandler).flags & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xab0,"(!typeHandler->GetIsShared())","!typeHandler->GetIsShared()"
                               );
    if (!bVar5) goto LAB_00e0dfd2;
    *puVar10 = 0;
  }
  pRVar2 = (this_00->singletonInstance).ptr;
  if ((pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
     ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef != instance)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xab1,
                                "(typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance)"
                                ,
                                "typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance"
                               );
    if (!bVar5) goto LAB_00e0dfd2;
    *puVar10 = 0;
  }
  pvVar4 = local_60;
  if ((flags & PropertyOperation_PreInit) == PropertyOperation_None) {
    local_38 = 0;
    if (((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
         PropertyOperation_None) && (0xf < (uint)local_48->pid)) {
      pRVar2 = (this_00->singletonInstance).ptr;
      if ((pRVar2 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) ||
         ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef != instance))
      goto LAB_00e0dda7;
      bVar5 = VarIs<Js::JavascriptFunction>(local_60);
      if (bVar5) {
        bVar5 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixMethodPropsPhase);
        local_38 = (uint)CONCAT71(extraout_var,bVar5) ^ 1;
      }
      else {
        bVar5 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixDataPropsPhase);
        if (bVar5) goto LAB_00e0dda7;
        bVar5 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_48,pvVar4);
        local_38 = (uint)CONCAT71(extraout_var_00,bVar5);
      }
    }
  }
  else {
LAB_00e0dda7:
    local_38 = 0;
  }
  if (((this_00->field_0x28 & 2) == 0) ||
     (bVar5 = SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_true>::
              TryReuseDeletedPropertyIndex
                        ((SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_true>
                          *)this_00,instance,local_32), !bVar5)) {
    uVar13 = propertyKey_local._4_4_;
    local_32[0] = *(ushort *)(this + 0x2a);
    Add<Js::PropertyRecord_const*>
              ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true> *)this_00
               ,local_48,(PropertyAttributes)propertyKey_local._4_4_,
               (flags & PropertyOperation_PreInit) == PropertyOperation_None,local_38._0_1_,false,
               local_50);
  }
  else {
    pSVar11 = JsUtil::
              BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
              ::GetValueAt((this_00->propertyMap).ptr,(uint)local_32[0]);
    uVar6 = pSVar11->propertyIndex;
    if (pSVar11->propertyIndex != local_32[0]) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xac0,
                                  "(typeHandler->propertyMap->GetValueAt(index).propertyIndex == index)"
                                  ,
                                  "typeHandler->propertyMap->GetValueAt(index).propertyIndex == index"
                                 );
      if (!bVar5) {
LAB_00e0dfd2:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar10 = 0;
      uVar6 = local_32[0];
    }
    deletedPropertyKey._4_4_ = (uint)((flags & PropertyOperation_PreInit) == PropertyOperation_None)
    ;
    ppJVar12 = JsUtil::
               BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
               ::GetKeyAt((this_00->propertyMap).ptr,(uint)uVar6);
    local_70 = *ppJVar12;
    JsUtil::
    BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
    ::Remove((this_00->propertyMap).ptr,&local_70);
    uVar13 = propertyKey_local._4_4_;
    Add<Js::PropertyRecord_const*>
              ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true> *)this_00
               ,local_32[0],local_48,(PropertyAttributes)propertyKey_local._4_4_,
               SUB41(deletedPropertyKey._4_4_,0),local_38._0_1_,false,local_50);
  }
  if ((uVar13 & 1) != 0) {
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
  }
  pvVar4 = local_60;
  DynamicTypeHandler::SetSlotUnchecked(instance,(uint)local_32[0],local_60);
  if ((char)local_38 == '\0' && (char)((flags & PropertyOperation_PreInit) >> 5) == '\0') {
    PVar7 = local_32[0];
    uVar13 = propertyKey_local._4_4_;
    if (local_58 == (PropertyValueInfo *)0x0) goto LAB_00e0df2e;
  }
  else {
    if (local_58 == (PropertyValueInfo *)0x0) goto LAB_00e0df2e;
    PVar7 = 0xffff;
    uVar13 = 0;
  }
  local_58->m_instance = &instance->super_RecyclableObject;
  local_58->m_propertyIndex = PVar7;
  local_58->m_attributes = (PropertyAttributes)uVar13;
  local_58->flags = InlineCacheNoFlags;
LAB_00e0df2e:
  uVar13 = local_48->pid;
  if (uVar13 != 0xffffffff) {
    if ((((this_00->super_DynamicTypeHandler).flags & 0x20) != 0) ||
       ((0xf < uVar13 &&
        (BVar9 = JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty
                           (&instance->super_RecyclableObject,uVar13), BVar9 != 0)))) {
      ScriptContext::InvalidateProtoCaches(local_50,uVar13);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              ((DynamicTypeHandler *)this,instance,uVar13,pvVar4,possibleSideEffects);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::AddProperty(DynamicObject* instance, TPropertyKey propertyKey, Var value, PropertyAttributes attributes,
        PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
#if DBG
        // Only Assert that the propertyMap doesn't contain propertyKey if TMapKey is string and propertyKey is not a symbol.
        if (!TMapKey_IsJavascriptString<TMapKey>() || !TMapKey_IsSymbol(propertyKey, scriptContext))
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            Assert(!propertyMap->TryGetReference(propertyKey, &descriptor));
        }
        Assert(!TPropertyKey_IsNumeric(propertyKey));
#endif

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (CONFIG_FLAG(ForceStringKeyedSimpleDictionaryTypeHandler) &&
            !TMapKey_IsJavascriptString<TMapKey>() &&
            !isUnordered && !hasNamelessPropertyId &&
            !TPropertyKey_IsInternalPropertyId(propertyKey) &&
            !TMapKey_IsSymbol(propertyKey, scriptContext))
        {
            return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                ->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
        }
#endif

        if (IsNotExtensibleSupported)
        {
            bool isForce = (flags & PropertyOperation_Force) != 0;
            if (!isForce)
            {
                bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;
                if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                {
                    return FALSE;
                }
            }
        }

        SimpleDictionaryTypeHandlerBase * typeHandler = this;
        if (GetIsLocked())
        {
            typeHandler = ConvertToNonSharedSimpleDictionaryType(instance);
        }
        else if(instance->GetDynamicType()->GetIsLocked())
        {
            Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

            // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
            instance->ChangeType();
        }

        if (TMapKey_IsJavascriptString<TMapKey>() &&
            (TPropertyKey_IsInternalPropertyId(propertyKey) || TMapKey_IsSymbol(propertyKey, scriptContext)))
        {
            PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning from string keyed to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"));
            // String keyed type handler cannot store InternalPropertyRecords since they have no string representation
            return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, const PropertyRecord*, IsNotExtensibleSupported>(instance)
                ->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
        }

        // CONSIDER: Do this after TryReuseDeletedPropertyIndex. If we can reuse slots, no need to grow right now.
        if (this->GetSlotCapacity() <= nextPropertyIndex)
        {
            if (this->GetSlotCapacity() >= MaxPropertyIndexSize)
            {
                BigSimpleDictionaryTypeHandler* newTypeHandler = ConvertToBigSimpleDictionaryTypeHandler(instance);

                return newTypeHandler->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
            }

            typeHandler->EnsureSlotCapacity(instance);
        }

        Assert((flags & PropertyOperation_SpecialValue) != 0 || value != nullptr);
        Assert(!typeHandler->GetIsShared());
        Assert(typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance);
#if ENABLE_FIXED_FIELDS
        bool markAsInitialized = ((flags & PropertyOperation_PreInit) == 0);
        bool markAsFixed = markAsInitialized && !TPropertyKey_IsInternalPropertyId(propertyKey) && (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0 &&
            typeHandler->singletonInstance != nullptr && typeHandler->singletonInstance->Get() == instance
            && (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyKey, value)));
#else
        bool markAsInitialized = true;
        bool markAsFixed = false;
#endif
        TPropertyIndex index;
        if (typeHandler->isUnordered &&
            typeHandler->AsUnordered()->TryReuseDeletedPropertyIndex(instance, &index))
        {
            // We are reusing a deleted property index for the new property ID. Update the property map.
            Assert(typeHandler->propertyMap->GetValueAt(index).propertyIndex == index);
            TMapKey deletedPropertyKey = typeHandler->propertyMap->GetKeyAt(index);
            typeHandler->propertyMap->Remove(deletedPropertyKey);
            typeHandler->Add(index, propertyKey, attributes, markAsInitialized, markAsFixed, false, scriptContext);
        }
        else
        {
            index = nextPropertyIndex;
            typeHandler->Add(propertyKey, attributes, markAsInitialized, markAsFixed, false, scriptContext);
        }

        if (attributes & PropertyEnumerable)
        {
            instance->SetHasNoEnumerableProperties(false);
        }

        SetSlotUnchecked(instance, index, value);

        // It's ok to populate inline cache here even if this handler isn't shared yet, because we don't have property add
        // inline cache flavor for SimpleDictionaryTypeHandlers.  This ensures that a) no new instance reaches this handler
        // without us knowing, and b) the inline cache doesn't inadvertently become polymorphic.
        if (markAsInitialized && !markAsFixed)
        {
            SetPropertyValueInfoNonFixed(info, instance, index, attributes);
        }
        else
        {
            PropertyValueInfo::SetNoCache(info, instance);
        }

        PropertyId propertyId = TPropertyKey_GetOptionalPropertyId(scriptContext, propertyKey);
        if (propertyId != Constants::NoProperty)
        {
            if ((typeHandler->GetFlags() & IsPrototypeFlag)
                || (!IsInternalPropertyId(propertyId)
                && JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty(instance, propertyId)))
            {
                // We don't evolve dictionary types when adding a field, so we need to invalidate prototype caches.
                // We only have to do this though if the current type is used as a prototype, or the current property
                // is found on the prototype chain.
                scriptContext->InvalidateProtoCaches(propertyId);
            }
            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
        }
        return true;
    }